

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::ModulationType::ModulationType
          (ModulationType *this,KBOOL FreqHop,KBOOL PseudoNoise,KBOOL TimeHop,
          KUINT16 MajorModulation,KUINT16 Detail,KUINT16 System)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__ModulationType_00216b18;
  *(byte *)&this->field_0 =
       PseudoNoise * '\x02' | FreqHop | TimeHop << 2 | *(byte *)&this->field_0 & 0xf8;
  this->m_ui16MajorModulationType = MajorModulation;
  this->m_ui16Detail = Detail;
  this->m_ui16System = System;
  return;
}

Assistant:

ModulationType::ModulationType( KBOOL FreqHop, KBOOL PseudoNoise, KBOOL TimeHop,
                                KUINT16 MajorModulation, KUINT16 Detail,
                                KUINT16 System ) :
    m_ui16FreqHop( FreqHop ),
    m_ui16PseudoNoise( PseudoNoise ),
    m_ui16TimeHop( TimeHop ),
    m_ui16MajorModulationType( MajorModulation ),
    m_ui16Detail( Detail ),
    m_ui16System( System )
{
}